

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayout::timerEvent(QMainWindowLayout *this,QTimerEvent *e)

{
  QMainWindowLayoutState *__ptr;
  
  if (*(int *)(e + 0x10) == *(int *)(this + 0x778)) {
    QBasicTimer::stop();
    __ptr = *(QMainWindowLayoutState **)(this + 0x6f8);
    *(undefined8 *)(this + 0x6f8) = 0;
    if (__ptr != (QMainWindowLayoutState *)0x0) {
      std::default_delete<QMainWindowLayoutState>::operator()
                ((default_delete<QMainWindowLayoutState> *)(this + 0x6f8),__ptr);
    }
  }
  QObject::timerEvent((QTimerEvent *)this);
  return;
}

Assistant:

void QMainWindowLayout::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == discardRestoredStateTimer.timerId()) {
        discardRestoredStateTimer.stop();
        restoredState.reset();
    }
    QLayout::timerEvent(e);
}